

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O0

_Bool tval_can_have_flavor_k(object_kind *kind)

{
  object_kind *kind_local;
  
  if ((kind->tval - 0x14U < 7) || (kind->tval == 0x1d)) {
    kind_local._7_1_ = true;
  }
  else {
    kind_local._7_1_ = false;
  }
  return kind_local._7_1_;
}

Assistant:

bool tval_can_have_flavor_k(const struct object_kind *kind)
{
	switch (kind->tval) {
		case TV_AMULET:
		case TV_RING:
		case TV_STAFF:
		case TV_WAND:
		case TV_ROD:
		case TV_POTION:
		case TV_MUSHROOM:
		case TV_SCROLL:
			return true;
		default:
			return false;
	}
}